

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.h
# Opt level: O1

bool __thiscall
Map::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
::contains(Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  Iterator IVar1;
  Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  local_b8;
  BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  local_58;
  
  BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  ::BPlusTree(&local_58,true);
  Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  ::Pair(&local_b8,key,
         (MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
          *)&local_58);
  IVar1 = BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
          ::search(&this->tree,&local_b8);
  BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  ::~BPlusTree(&local_b8.value.tree);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.key._M_dataplus._M_p != &local_b8.key.field_2) {
    operator_delete(local_b8.key._M_dataplus._M_p);
  }
  BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  ::~BPlusTree(&local_58);
  return IVar1.node_ptr !=
         (BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
          *)0x0;
}

Assistant:

bool Map<Key, T>::contains(const Key& key) {
    auto search = tree.search(key);
    return search != nullptr;
}